

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# videomenu.cpp
# Opt level: O3

bool __thiscall DVideoModeMenu::Responder(DVideoModeMenu *this,event_t *ev)

{
  bool bVar1;
  int iVar2;
  FSoundID local_14;
  
  if (((ev->type == '\x04') && (ev->subtype == '\x01')) && ((ushort)(ev->data1 | 0x20U) == 0x74)) {
    bVar1 = GetSelectedSize((int *)this,(int *)ev);
    if (bVar1) {
      OldHeight = screen->VideoHeight;
      OldBits = DisplayBits;
      NewBits = (int)BitTranslate[DummyDepthCvar.Value];
      setmodeneeded = true;
      OldWidth = screen->VideoWidth;
      iVar2 = (*I_GetTime)(false);
      testingmode = iVar2 + 0xaf;
      S_FindSound("menu/choose");
      S_Sound(0x22,&local_14,snd_menuvolume.Value,0.0);
      SetModesMenu(NewWidth,NewHeight,NewBits);
      return true;
    }
    NewHeight = screen->VideoHeight;
    NewWidth = screen->VideoWidth;
  }
  bVar1 = DOptionMenu::Responder(&this->super_DOptionMenu,ev);
  return bVar1;
}

Assistant:

bool Responder(event_t *ev)
	{
		if (ev->type == EV_GUI_Event && ev->subtype == EV_GUI_KeyDown &&
			(ev->data1 == 't' || ev->data1 == 'T'))
		{
			if (!GetSelectedSize (&NewWidth, &NewHeight))
			{
				NewWidth = screen->VideoWidth;
				NewHeight = screen->VideoHeight;
			}
			else
			{
				OldWidth = screen->VideoWidth;
				OldHeight = screen->VideoHeight;
				OldBits = DisplayBits;
				NewBits = BitTranslate[DummyDepthCvar];
				setmodeneeded = true;
				testingmode = I_GetTime(false) + 5 * TICRATE;
				S_Sound (CHAN_VOICE | CHAN_UI, "menu/choose", snd_menuvolume, ATTN_NONE);
				SetModesMenu (NewWidth, NewHeight, NewBits);
				return true;
			}
		}
		return Super::Responder(ev);
	}